

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab_employees.h
# Opt level: O2

void __thiscall lab_employees::lab_employees(lab_employees *this,Person *person,char *Subject)

{
  char *pcVar1;
  
  Person::Person(&this->super_Person);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_CheckPassword_00107d38;
  (this->super_Person).id = person->id;
  pcVar1 = person->surname;
  (this->super_Person).name = person->name;
  (this->super_Person).surname = pcVar1;
  (this->super_Person).gender = person->gender;
  (this->super_Person).age = person->age;
  (this->super_Person).subject = Subject;
  (this->super_Person).access_level = 2;
  return;
}

Assistant:

lab_employees(Person *person,char* Subject) {
        this->id = person->getId();
        this->name = person->getName();
        this->surname = person->getSurname();
        this->gender = person->getGender();
        this->age = person->getAge();
        this->subject = Subject;
        this->access_level = 2;
    }